

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

void Ga2_ManAbsPrintFrame(Ga2_Man_t *p,int nFrames,int nConfls,int nCexes,abctime Time,int fFinal)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  int level;
  Ga2_Man_t *pGVar5;
  sat_solver2 *s;
  bool bVar6;
  double dVar7;
  double dVar8;
  
  if (nCexes == 0 || fFinal == 0) {
    bVar6 = p->pPars->fVeryVerbose != 0;
    pGVar5 = p;
    iVar1 = Abc_FrameIsBatchMode();
    level = (int)pGVar5;
    if (iVar1 != 0 && !bVar6) {
      return;
    }
  }
  else {
    pGVar5 = p;
    Abc_FrameIsBatchMode();
    level = (int)pGVar5;
    bVar6 = true;
  }
  p->fUseNewLine = (uint)bVar6;
  Abc_Print(level,"%4d :",(ulong)(uint)nFrames);
  uVar2 = (p->vAbs->nSize * 100) / p->nMarked;
  uVar3 = 100;
  if ((int)uVar2 < 100) {
    uVar3 = (ulong)uVar2;
  }
  Abc_Print(level,"%4d",uVar3);
  Abc_Print(level,"%6d",(ulong)(uint)p->vAbs->nSize);
  Abc_Print(level,"%5d",(ulong)(uint)(~p->vAbs->nSize + p->vValues->nSize));
  pGVar5 = p;
  uVar2 = Ga2_GlaAbsCount(p,1,0);
  Abc_Print((int)pGVar5,"%5d",(ulong)uVar2);
  pGVar5 = p;
  uVar2 = Ga2_GlaAbsCount(p,0,1);
  iVar1 = (int)pGVar5;
  Abc_Print(iVar1,"%6d",(ulong)uVar2);
  Abc_Print(iVar1,"%8d",(ulong)(uint)nConfls);
  if (nCexes == 0) {
    pcVar4 = "%5c";
    uVar3 = 0x2d;
  }
  else {
    pcVar4 = "%5d";
    uVar3 = (ulong)(uint)nCexes;
  }
  Abc_Print(iVar1,pcVar4,uVar3);
  Abc_PrintInt(p->pSat->size);
  Abc_PrintInt((p->pSat->stats).clauses);
  uVar2 = (p->pSat->stats).learnts;
  Abc_PrintInt(uVar2);
  Abc_Print(uVar2,"%9.2f sec",(double)Time / 1000000.0);
  dVar7 = sat_solver2_memory_proof(p->pSat);
  s = p->pSat;
  dVar8 = sat_solver2_memory(s,0);
  iVar1 = (int)s;
  Abc_Print(iVar1,"%5.0f MB",(dVar8 + dVar7) * 9.5367431640625e-07);
  pcVar4 = "\r";
  if (bVar6 != false) {
    pcVar4 = "\n";
  }
  Abc_Print(iVar1,"%s",pcVar4);
  fflush(_stdout);
}

Assistant:

void Ga2_ManAbsPrintFrame( Ga2_Man_t * p, int nFrames, int nConfls, int nCexes, abctime Time, int fFinal )
{
    int fUseNewLine = ((fFinal && nCexes) || p->pPars->fVeryVerbose);
    if ( Abc_FrameIsBatchMode() && !fUseNewLine )
        return;
    p->fUseNewLine = fUseNewLine;
    Abc_Print( 1, "%4d :", nFrames );
    Abc_Print( 1, "%4d", Abc_MinInt(100, 100 * Vec_IntSize(p->vAbs) / p->nMarked) ); 
    Abc_Print( 1, "%6d", Vec_IntSize(p->vAbs) );
    Abc_Print( 1, "%5d", Vec_IntSize(p->vValues)-Vec_IntSize(p->vAbs)-1 );
    Abc_Print( 1, "%5d", Ga2_GlaAbsCount(p, 1, 0) );
    Abc_Print( 1, "%6d", Ga2_GlaAbsCount(p, 0, 1) );
    Abc_Print( 1, "%8d", nConfls );
    if ( nCexes == 0 )
        Abc_Print( 1, "%5c", '-' ); 
    else
        Abc_Print( 1, "%5d", nCexes ); 
    Abc_PrintInt( sat_solver2_nvars(p->pSat) );
    Abc_PrintInt( sat_solver2_nclauses(p->pSat) );
    Abc_PrintInt( sat_solver2_nlearnts(p->pSat) );
    Abc_Print( 1, "%9.2f sec", 1.0*Time/CLOCKS_PER_SEC );
    Abc_Print( 1, "%5.0f MB", (sat_solver2_memory_proof(p->pSat) + sat_solver2_memory(p->pSat, 0)) / (1<<20) );
    Abc_Print( 1, "%s", fUseNewLine ? "\n" : "\r" );
    fflush( stdout );
}